

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_example_ips(multi_ex *examples,label *cs_labels)

{
  value_type peVar1;
  v_array<COST_SENSITIVE::wclass> *this;
  v_array<COST_SENSITIVE::wclass> *pvVar2;
  reference ppeVar3;
  size_t sVar4;
  cb_class *pcVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  wclass wc;
  label ld;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffb0;
  v_array<CB::cb_class> local_38;
  uint local_14;
  vector<example_*,_std::allocator<example_*>_> *local_8;
  
  local_8 = in_RDI;
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffb0);
  local_14 = 0;
  while( true ) {
    this = (v_array<COST_SENSITIVE::wclass> *)(ulong)local_14;
    pvVar2 = (v_array<COST_SENSITIVE::wclass> *)
             std::vector<example_*,_std::allocator<example_*>_>::size(local_8);
    if (pvVar2 <= this) break;
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_8,(ulong)local_14);
    peVar1 = *ppeVar3;
    local_38._begin = *(cb_class **)&(peVar1->l).multi;
    local_38._end = (cb_class *)(peVar1->l).cs.costs._end;
    local_38.end_array = (cb_class *)(peVar1->l).cs.costs.end_array;
    local_38.erase_count = (peVar1->l).cs.costs.erase_count;
    sVar4 = v_array<CB::cb_class>::size(&local_38);
    if (sVar4 == 1) {
      pcVar5 = v_array<CB::cb_class>::operator[](&local_38,0);
      if ((pcVar5->cost != 3.4028235e+38) || (NAN(pcVar5->cost))) {
        pcVar5 = v_array<CB::cb_class>::operator[](&local_38,0);
        in_stack_ffffffffffffffac = pcVar5->cost;
        v_array<CB::cb_class>::operator[](&local_38,0);
        safe_probability(6.628294e-39);
      }
    }
    v_array<COST_SENSITIVE::wclass>::push_back
              (this,(wclass *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void gen_cs_example_ips(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
      wc.x = ld.costs[0].cost / safe_probability(ld.costs[0].probability);
    cs_labels.costs.push_back(wc);
  }
}